

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O3

size_t gl3cts::TextureSwizzle::get_swizzled_channel_idx(size_t channel_idx,GLint *swizzle_set)

{
  int iVar1;
  size_t sVar2;
  TestError *this;
  
  iVar1 = swizzle_set[channel_idx];
  switch(iVar1) {
  case 0x1903:
    sVar2 = 0;
    break;
  case 0x1904:
    sVar2 = 1;
    break;
  case 0x1905:
    sVar2 = 2;
    break;
  case 0x1906:
    sVar2 = 3;
    break;
  default:
    if (iVar1 == 0) {
      sVar2 = 5;
    }
    else {
      if (iVar1 != 1) {
        this = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this,"Invalid value",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                   ,0x764);
        __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      sVar2 = 4;
    }
  }
  return sVar2;
}

Assistant:

size_t get_swizzled_channel_idx(const size_t channel_idx, const glw::GLint swizzle_set[4])
{
	const glw::GLint swizzle = swizzle_set[channel_idx];

	size_t channel = 0;

	switch (swizzle)
	{
	case GL_RED:
		channel = 0;
		break;
	case GL_GREEN:
		channel = 1;
		break;
	case GL_BLUE:
		channel = 2;
		break;
	case GL_ALPHA:
		channel = 3;
		break;
	case GL_ONE:
		channel = CHANNEL_INDEX_ONE;
		break;
	case GL_ZERO:
		channel = CHANNEL_INDEX_ZERO;
		break;
	default:
		TCU_FAIL("Invalid value");
		break;
	}

	return channel;
}